

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O1

void __thiscall
google::protobuf::util::DefaultFieldComparator::SetFractionAndMargin
          (DefaultFieldComparator *this,FieldDescriptor *field,double fraction,double margin)

{
  FieldDescriptor *pFVar1;
  LogMessage *pLVar2;
  mapped_type *pmVar3;
  code *local_80 [7];
  FieldDescriptor *local_48;
  double local_40;
  double local_38;
  FieldDescriptor *local_30;
  FieldDescriptor *field_local;
  
  local_40 = margin;
  local_38 = fraction;
  local_30 = field;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_80[0] = FieldDescriptor::TypeOnceInit;
    local_48 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_80,&local_48);
  }
  pFVar1 = local_30;
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 6) {
    if (*(once_flag **)(local_30 + 0x30) != (once_flag *)0x0) {
      local_80[0] = FieldDescriptor::TypeOnceInit;
      local_48 = local_30;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(local_30 + 0x30),local_80,&local_48);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar1 + 0x38) * 4) != 5) {
      protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_comparator.cc"
                 ,0x94);
      pLVar2 = protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_80,
                          "CHECK failed: FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() || FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type(): "
                         );
      pLVar2 = protobuf::internal::LogMessage::operator<<
                         (pLVar2,"Field has to be float or double type. Field name is: ");
      pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,*(string **)(local_30 + 8));
      protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&field_local + 7),pLVar2);
      protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_80);
    }
  }
  pmVar3 = std::
           map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::DefaultFieldComparator::Tolerance,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::DefaultFieldComparator::Tolerance>_>_>
           ::operator[](&this->map_tolerance_,&local_30);
  pmVar3->fraction = local_38;
  pmVar3->margin = local_40;
  return;
}

Assistant:

void DefaultFieldComparator::SetFractionAndMargin(const FieldDescriptor* field,
                                                  double fraction,
                                                  double margin) {
  GOOGLE_CHECK(FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() ||
        FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type())
      << "Field has to be float or double type. Field name is: "
      << field->full_name();
  map_tolerance_[field] = Tolerance(fraction, margin);
}